

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void likeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  sqlite3 *psVar1;
  Mem *pMem;
  int iVar2;
  u32 matchOther;
  uint uVar3;
  byte *pbVar4;
  u8 *zPattern;
  u8 *zString;
  byte bVar5;
  int iVar6;
  compareInfo *pInfo;
  compareInfo backupInfo;
  uchar *zEsc;
  compareInfo local_34;
  byte *local_30;
  
  psVar1 = context->pOut->db;
  pInfo = (compareInfo *)context->pFunc->pUserData;
  iVar2 = sqlite3ValueBytes(*argv,'\x01');
  if (psVar1->aLimit[8] < iVar2) {
    context->isError = 1;
    sqlite3VdbeMemSetStr
              (context->pOut,"LIKE or GLOB pattern too complex",-1,'\x01',
               (_func_void_void_ptr *)0xffffffffffffffff);
    return;
  }
  if (argc == 3) {
    local_30 = (byte *)sqlite3ValueText(argv[2],'\x01');
    if (local_30 == (byte *)0x0) {
      return;
    }
    bVar5 = *local_30;
    if (local_30 != (byte *)0xffffffffffffffff && bVar5 != 0) {
      pbVar4 = local_30;
      iVar2 = 0;
      do {
        iVar6 = iVar2;
        if (bVar5 < 0xc0) {
          bVar5 = pbVar4[1];
        }
        else {
          bVar5 = pbVar4[1];
        }
        pbVar4 = pbVar4 + 1;
      } while ((bVar5 != 0) && (iVar2 = iVar6 + 1, pbVar4 != (byte *)0xffffffffffffffff));
      if (iVar6 == 0) {
        matchOther = sqlite3Utf8Read(&local_30);
        if ((matchOther == pInfo->matchAll) || (matchOther == pInfo->matchOne)) {
          local_34 = *pInfo;
          uVar3 = (uint)local_34 >> 8;
          if (matchOther == ((uint)local_34 & 0xff)) {
            local_34 = (compareInfo)((uint)local_34 & 0xffffff00);
          }
          pInfo = &local_34;
          if (matchOther == (uVar3 & 0xff)) {
            local_34.matchOne = '\0';
          }
        }
        goto LAB_0019595d;
      }
    }
    context->isError = 1;
    sqlite3VdbeMemSetStr
              (context->pOut,"ESCAPE expression must be a single character",-1,'\x01',
               (_func_void_void_ptr *)0xffffffffffffffff);
  }
  else {
    matchOther = (u32)pInfo->matchSet;
LAB_0019595d:
    zPattern = (u8 *)sqlite3ValueText(*argv,'\x01');
    zString = (u8 *)sqlite3ValueText(argv[1],'\x01');
    if (zPattern != (u8 *)0x0 && zString != (u8 *)0x0) {
      iVar2 = patternCompare(zPattern,zString,pInfo,matchOther);
      pMem = context->pOut;
      if ((pMem->flags & 0x9000) == 0) {
        (pMem->u).i = (ulong)(iVar2 == 0);
        pMem->flags = 4;
      }
      else {
        vdbeReleaseAndSetInt64(pMem,(ulong)(iVar2 == 0));
      }
    }
  }
  return;
}

Assistant:

static void likeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *zA, *zB;
  u32 escape;
  int nPat;
  sqlite3 *db = sqlite3_context_db_handle(context);
  struct compareInfo *pInfo = sqlite3_user_data(context);
  struct compareInfo backupInfo;

#ifdef SQLITE_LIKE_DOESNT_MATCH_BLOBS
  if( sqlite3_value_type(argv[0])==SQLITE_BLOB
   || sqlite3_value_type(argv[1])==SQLITE_BLOB
  ){
#ifdef SQLITE_TEST
    sqlite3_like_count++;
#endif
    sqlite3_result_int(context, 0);
    return;
  }
#endif

  /* Limit the length of the LIKE or GLOB pattern to avoid problems
  ** of deep recursion and N*N behavior in patternCompare().
  */
  nPat = sqlite3_value_bytes(argv[0]);
  testcase( nPat==db->aLimit[SQLITE_LIMIT_LIKE_PATTERN_LENGTH] );
  testcase( nPat==db->aLimit[SQLITE_LIMIT_LIKE_PATTERN_LENGTH]+1 );
  if( nPat > db->aLimit[SQLITE_LIMIT_LIKE_PATTERN_LENGTH] ){
    sqlite3_result_error(context, "LIKE or GLOB pattern too complex", -1);
    return;
  }
  if( argc==3 ){
    /* The escape character string must consist of a single UTF-8 character.
    ** Otherwise, return an error.
    */
    const unsigned char *zEsc = sqlite3_value_text(argv[2]);
    if( zEsc==0 ) return;
    if( sqlite3Utf8CharLen((char*)zEsc, -1)!=1 ){
      sqlite3_result_error(context,
          "ESCAPE expression must be a single character", -1);
      return;
    }
    escape = sqlite3Utf8Read(&zEsc);
    if( escape==pInfo->matchAll || escape==pInfo->matchOne ){
      memcpy(&backupInfo, pInfo, sizeof(backupInfo));
      pInfo = &backupInfo;
      if( escape==pInfo->matchAll ) pInfo->matchAll = 0;
      if( escape==pInfo->matchOne ) pInfo->matchOne = 0;
    }
  }else{
    escape = pInfo->matchSet;
  }
  zB = sqlite3_value_text(argv[0]);
  zA = sqlite3_value_text(argv[1]);
  if( zA && zB ){
#ifdef SQLITE_TEST
    sqlite3_like_count++;
#endif
    sqlite3_result_int(context,
                      patternCompare(zB, zA, pInfo, escape)==SQLITE_MATCH);
  }
}